

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void Node_AddNotify_Update(node *Node,dataid Id,notifyproc Func,void *Refered)

{
  nodeevt Pin;
  nodeevt local_30;
  
  Node_AddNotify(Node,Id,Func,Refered);
  if (Func != (notifyproc)0x0) {
    local_30.Node = Node;
    local_30.Id = Id;
    (*Func)(Refered,&local_30);
  }
  return;
}

Assistant:

void Node_AddNotify_Update(node* Node, dataid Id, notifyproc Func, void* Refered)
{
    Node_AddNotify(Node,Id,Func,Refered);
    if (Func)
    {
        nodeevt Pin;
        Pin.Node = Node;
        Pin.Id = Id;
        Func(Refered,&Pin);
    }
}